

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

uint __thiscall
xercesc_4_0::ElemStack::mapPrefixToURI(ElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  StackElem *pSVar3;
  bool bVar4;
  ulong uVar5;
  PoolElem *pPVar6;
  ElemStack *pEVar7;
  XMLSize_t XVar8;
  XMLCh *pXVar9;
  XMLCh XVar10;
  XMLSize_t XVar11;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar12;
  
  *unknown = false;
  if ((prefixToMap == (XMLCh *)0x0) || (uVar5 = (ulong)(ushort)*prefixToMap, uVar5 == 0)) {
    pPVar6 = (PoolElem *)&this->fGlobalPoolId;
LAB_0029bfc2:
    uVar1 = pPVar6->fId;
    if (uVar1 != 0) {
      if (uVar1 == this->fXMLPoolId) {
        pEVar7 = (ElemStack *)&this->fXMLNamespaceId;
        goto LAB_0029c09f;
      }
      if (uVar1 == this->fXMLNSPoolId) {
        pEVar7 = (ElemStack *)&this->fXMLNSNamespaceId;
        goto LAB_0029c09f;
      }
      XVar8 = this->fStackTop;
      if (XVar8 != 0) {
        do {
          XVar11 = this->fStack[XVar8 - 1]->fMapCount;
          if (XVar11 != 0) {
            pEVar7 = (ElemStack *)&this->fStack[XVar8 - 1]->fMap->fURIId;
            do {
              if (*(uint *)((long)&pEVar7[-1].fMemoryManager + 4) == uVar1) goto LAB_0029c09f;
              pEVar7 = (ElemStack *)&pEVar7->fPrefixPool;
              XVar11 = XVar11 - 1;
            } while (XVar11 != 0);
          }
          XVar8 = XVar8 - 1;
        } while (XVar8 != 0);
      }
      pSVar3 = this->fGlobalNamespaces;
      if ((pSVar3 != (StackElem *)0x0) && (XVar8 = pSVar3->fMapCount, XVar8 != 0)) {
        pEVar7 = (ElemStack *)&pSVar3->fMap->fURIId;
        do {
          if (*(uint *)((long)&pEVar7[-1].fMemoryManager + 4) == uVar1) goto LAB_0029c09f;
          pEVar7 = (ElemStack *)&pEVar7->fPrefixPool;
          XVar8 = XVar8 - 1;
        } while (XVar8 != 0);
      }
      pEVar7 = this;
      if (*prefixToMap == L'\0') goto LAB_0029c09f;
    }
  }
  else {
    pRVar2 = (this->fPrefixPool).fHashTable;
    XVar10 = prefixToMap[1];
    if (XVar10 != L'\0') {
      pXVar9 = prefixToMap + 2;
      do {
        uVar5 = (ulong)(ushort)XVar10 + (uVar5 >> 0x18) + uVar5 * 0x26;
        XVar10 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar10 != L'\0');
    }
    pRVar12 = pRVar2->fBucketList[uVar5 % pRVar2->fHashModulus];
    if (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      do {
        bVar4 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,prefixToMap,pRVar12->fKey);
        if (bVar4) {
          pPVar6 = pRVar12->fData;
          if (pPVar6 != (PoolElem *)0x0) goto LAB_0029bfc2;
          break;
        }
        pRVar12 = pRVar12->fNext;
      } while (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
    }
  }
  *unknown = true;
  pEVar7 = (ElemStack *)&this->fUnknownNamespaceId;
LAB_0029c09f:
  return pEVar7->fEmptyNamespaceId;
}

Assistant:

unsigned int ElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                        ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = (!prefixToMap || !*prefixToMap)?fGlobalPoolId : fPrefixPool.getId(prefixToMap);
    if (prefixId == 0)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }
    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    else if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (XMLSize_t index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // Search the map at this level for the passed prefix
        for (XMLSize_t mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }
    //  If the prefix wasn't found, try in the global namespaces
    if(fGlobalNamespaces)
    {
        for (XMLSize_t mapIndex = 0; mapIndex < fGlobalNamespaces->fMapCount; mapIndex++)
        {
            if (fGlobalNamespaces->fMap[mapIndex].fPrefId == prefixId)
                return fGlobalNamespaces->fMap[mapIndex].fURIId;
        }
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}